

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXModel.cpp
# Opt level: O0

void __thiscall Assimp::FBX::Model::ResolveLinks(Model *this,Element *element,Document *doc)

{
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_> *this_00
  ;
  bool bVar1;
  uint64_t dest;
  size_type sVar2;
  reference ppCVar3;
  long lVar4;
  value_type local_170;
  NodeAttribute *local_160;
  Geometry *local_150;
  allocator local_f1;
  string local_f0;
  value_type local_d0;
  NodeAttribute *att;
  Geometry *geo;
  Material *mat;
  string local_b0;
  Object *local_90;
  Object *ob;
  Connection *con;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  *__range2;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_> local_58
  ;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  *local_40;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_> *conns;
  char *arr [3];
  Document *doc_local;
  Element *element_local;
  Model *this_local;
  
  arr[1] = "NodeAttribute";
  conns = (vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
           *)0xc543d4;
  arr[0] = "Material";
  arr[2] = (char *)doc;
  dest = FBX::Object::ID(&this->super_Object);
  Document::GetConnectionsByDestinationSequenced(&local_58,doc,dest,(char **)&conns,3);
  local_40 = &local_58;
  sVar2 = std::
          vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
          ::size(&local_58);
  std::vector<const_Assimp::FBX::Material_*,_std::allocator<const_Assimp::FBX::Material_*>_>::
  reserve(&this->materials,sVar2);
  sVar2 = std::
          vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
          ::size(local_40);
  std::vector<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>::
  reserve(&this->geometry,sVar2);
  sVar2 = std::
          vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
          ::size(local_40);
  std::
  vector<const_Assimp::FBX::NodeAttribute_*,_std::allocator<const_Assimp::FBX::NodeAttribute_*>_>::
  reserve(&this->attributes,sVar2);
  this_00 = local_40;
  __end2 = std::
           vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
           ::begin(local_40);
  con = (Connection *)
        std::
        vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>::
        end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_Assimp::FBX::Connection_*const_*,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
                                     *)&con), bVar1) {
    ppCVar3 = __gnu_cxx::
              __normal_iterator<const_Assimp::FBX::Connection_*const_*,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
              ::operator*(&__end2);
    ob = (Object *)*ppCVar3;
    Connection::PropertyName_abi_cxx11_((Connection *)ob);
    lVar4 = std::__cxx11::string::length();
    if (lVar4 == 0) {
      local_90 = Connection::SourceObject((Connection *)ob);
      if (local_90 == (Object *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_b0,
                   "failed to read source object for incoming Model link, ignoring",
                   (allocator *)((long)&mat + 7));
        Util::DOMWarning(&local_b0,element);
        std::__cxx11::string::~string((string *)&local_b0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&mat + 7));
      }
      else {
        if (local_90 == (Object *)0x0) {
          local_150 = (Geometry *)0x0;
        }
        else {
          local_150 = (Geometry *)
                      __dynamic_cast(local_90,&FBX::Object::typeinfo,&FBX::Material::typeinfo,0);
        }
        geo = local_150;
        if (local_150 == (Geometry *)0x0) {
          if (local_90 == (Object *)0x0) {
            local_160 = (NodeAttribute *)0x0;
          }
          else {
            local_160 = (NodeAttribute *)
                        __dynamic_cast(local_90,&FBX::Object::typeinfo,&Geometry::typeinfo,0);
          }
          att = local_160;
          if (local_160 == (NodeAttribute *)0x0) {
            if (local_90 == (Object *)0x0) {
              local_170 = (value_type)0x0;
            }
            else {
              local_170 = (value_type)
                          __dynamic_cast(local_90,&FBX::Object::typeinfo,&NodeAttribute::typeinfo,0)
              ;
            }
            local_d0 = local_170;
            if (local_170 == (value_type)0x0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_f0,
                         "source object for model link is neither Material, NodeAttribute nor Geometry, ignoring"
                         ,&local_f1);
              Util::DOMWarning(&local_f0,element);
              std::__cxx11::string::~string((string *)&local_f0);
              std::allocator<char>::~allocator((allocator<char> *)&local_f1);
            }
            else {
              std::
              vector<const_Assimp::FBX::NodeAttribute_*,_std::allocator<const_Assimp::FBX::NodeAttribute_*>_>
              ::push_back(&this->attributes,&local_d0);
            }
          }
          else {
            std::
            vector<const_Assimp::FBX::Geometry_*,_std::allocator<const_Assimp::FBX::Geometry_*>_>::
            push_back(&this->geometry,(value_type *)&att);
          }
        }
        else {
          std::vector<const_Assimp::FBX::Material_*,_std::allocator<const_Assimp::FBX::Material_*>_>
          ::push_back(&this->materials,(value_type *)&geo);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_Assimp::FBX::Connection_*const_*,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
    ::operator++(&__end2);
  }
  std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>::
  ~vector(&local_58);
  return;
}

Assistant:

void Model::ResolveLinks(const Element& element, const Document& doc)
{
    const char* const arr[] = {"Geometry","Material","NodeAttribute"};

    // resolve material
    const std::vector<const Connection*>& conns = doc.GetConnectionsByDestinationSequenced(ID(),arr, 3);

    materials.reserve(conns.size());
    geometry.reserve(conns.size());
    attributes.reserve(conns.size());
    for(const Connection* con : conns) {

        // material and geometry links should be Object-Object connections
        if (con->PropertyName().length()) {
            continue;
        }

        const Object* const ob = con->SourceObject();
        if(!ob) {
            DOMWarning("failed to read source object for incoming Model link, ignoring",&element);
            continue;
        }

        const Material* const mat = dynamic_cast<const Material*>(ob);
        if(mat) {
            materials.push_back(mat);
            continue;
        }

        const Geometry* const geo = dynamic_cast<const Geometry*>(ob);
        if(geo) {
            geometry.push_back(geo);
            continue;
        }

        const NodeAttribute* const att = dynamic_cast<const NodeAttribute*>(ob);
        if(att) {
            attributes.push_back(att);
            continue;
        }

        DOMWarning("source object for model link is neither Material, NodeAttribute nor Geometry, ignoring",&element);
        continue;
    }
}